

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O2

ByteData * cfd::core::CryptoUtil::DecodeBase64(ByteData *__return_storage_ptr__,string *str)

{
  pointer pcVar1;
  pointer puVar2;
  pointer puVar3;
  pointer puVar4;
  string *psVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  ByteData *byteData;
  ulong uVar10;
  byte local_82;
  char local_81;
  ByteData *local_80;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_78;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  string *local_38;
  
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar7 = str->_M_string_length;
  if ((uVar7 & 3) == 0) {
    local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_80 = __return_storage_ptr__;
    local_38 = str;
    for (uVar10 = 0; psVar5 = local_38, __return_storage_ptr__ = local_80, uVar10 < uVar7;
        uVar10 = uVar10 + 4) {
      pcVar1 = (local_38->_M_dataplus)._M_p;
      if ((pcVar1[uVar10] == '=') || (pcVar1[uVar10 + 1] == '=')) {
        ByteData::ByteData(local_80,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                    &local_58);
        goto LAB_002a6d06;
      }
      uVar7 = (ulong)(uint)(int)pcVar1[uVar10];
      if (pcVar1[uVar10 + 2] == '=') {
        lVar6 = ::std::__cxx11::string::find('\0',uVar7);
        uVar7 = ::std::__cxx11::string::find
                          ('\0',(ulong)(uint)(int)(psVar5->_M_dataplus)._M_p[uVar10 + 1]);
        __return_storage_ptr__ = local_80;
        if ((lVar6 == -1) || (uVar7 == 0xffffffffffffffff)) {
          ByteData::ByteData(local_80,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      &local_58);
          goto LAB_002a6d06;
        }
        local_82 = ((byte)(uVar7 >> 4) & 3) + (char)lVar6 * '\x04';
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_78,&local_82);
        break;
      }
      local_81 = pcVar1[uVar10 + 3];
      lVar6 = ::std::__cxx11::string::find('\0',uVar7);
      uVar7 = ::std::__cxx11::string::find
                        ('\0',(ulong)(uint)(int)(psVar5->_M_dataplus)._M_p[uVar10 + 1]);
      uVar8 = ::std::__cxx11::string::find
                        ('\0',(ulong)(uint)(int)(psVar5->_M_dataplus)._M_p[uVar10 + 2]);
      __return_storage_ptr__ = local_80;
      if (local_81 == '=') {
        if (((lVar6 == -1) || (uVar7 == 0xffffffffffffffff)) || (uVar8 == 0xffffffffffffffff)) {
          ByteData::ByteData(local_80,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      &local_58);
          goto LAB_002a6d06;
        }
        local_82 = ((byte)(uVar7 >> 4) & 3) + (char)lVar6 * '\x04';
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_78,&local_82);
        local_82 = (byte)((uint)uVar8 >> 2) & 0xf | (byte)((int)uVar7 << 4);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_78,&local_82);
        break;
      }
      lVar9 = ::std::__cxx11::string::find
                        ('\0',(ulong)(uint)(int)(psVar5->_M_dataplus)._M_p[uVar10 + 3]);
      __return_storage_ptr__ = local_80;
      if (((lVar6 == -1) || (uVar7 == 0xffffffffffffffff)) ||
         ((uVar8 == 0xffffffffffffffff || (lVar9 == -1)))) {
        ByteData::ByteData(local_80,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                    &local_58);
        goto LAB_002a6d06;
      }
      local_82 = ((byte)(uVar7 >> 4) & 3) + (char)lVar6 * '\x04';
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_78,&local_82);
      local_82 = (byte)(uVar8 >> 2) & 0xf | (byte)((int)uVar7 << 4);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_78,&local_82);
      local_82 = (byte)lVar9 & 0x3f | (byte)((uint)uVar8 << 6);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_78,&local_82);
      uVar7 = local_38->_M_string_length;
    }
    puVar4 = local_58._M_impl.super__Vector_impl_data._M_end_of_storage;
    puVar3 = local_58._M_impl.super__Vector_impl_data._M_finish;
    puVar2 = local_58._M_impl.super__Vector_impl_data._M_start;
    __return_storage_ptr__ = local_80;
    local_58._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_78._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_58._M_impl.super__Vector_impl_data._M_start =
         local_78._M_impl.super__Vector_impl_data._M_start;
    local_58._M_impl.super__Vector_impl_data._M_finish =
         local_78._M_impl.super__Vector_impl_data._M_finish;
    local_78._M_impl.super__Vector_impl_data._M_start = puVar2;
    local_78._M_impl.super__Vector_impl_data._M_finish = puVar3;
    local_78._M_impl.super__Vector_impl_data._M_end_of_storage = puVar4;
    ByteData::ByteData(local_80,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_58);
LAB_002a6d06:
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_78);
  }
  else {
    ByteData::ByteData(__return_storage_ptr__,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_58);
  }
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_58);
  return __return_storage_ptr__;
}

Assistant:

ByteData CryptoUtil::DecodeBase64(const std::string &str) {
  std::vector<uint8_t> dst;
  if (str.size() & 0x00000003) {
    ByteData byteData(dst);
    return byteData;
  }

  std::vector<uint8_t> cdst;
  for (std::size_t i = 0; i < str.size(); i += 4) {
    if (str[i + 0] == '=') {
      ByteData byteData(dst);
      return byteData;

    } else if (str[i + 1] == '=') {
      ByteData byteData(dst);
      return byteData;

    } else if (str[i + 2] == '=') {
      const std::string::size_type s1 = kBase64EncodeTable.find(str[i + 0]);
      const std::string::size_type s2 = kBase64EncodeTable.find(str[i + 1]);

      if (s1 == std::string::npos || s2 == std::string::npos) {
        ByteData byteData(dst);
        return byteData;
      }

      cdst.push_back(
          static_cast<uint8_t>(((s1 & 0x3F) << 2) | ((s2 & 0x30) >> 4)));

      break;
    } else if (str[i + 3] == '=') {
      const std::string::size_type s1 = kBase64EncodeTable.find(str[i + 0]);
      const std::string::size_type s2 = kBase64EncodeTable.find(str[i + 1]);
      const std::string::size_type s3 = kBase64EncodeTable.find(str[i + 2]);

      if (s1 == std::string::npos || s2 == std::string::npos ||
          s3 == std::string::npos) {
        ByteData byteData(dst);
        return byteData;
      }

      cdst.push_back(
          static_cast<uint8_t>(((s1 & 0x3F) << 2) | ((s2 & 0x30) >> 4)));
      cdst.push_back(
          static_cast<uint8_t>(((s2 & 0x0F) << 4) | ((s3 & 0x3C) >> 2)));

      break;
    } else {
      const std::string::size_type s1 = kBase64EncodeTable.find(str[i + 0]);
      const std::string::size_type s2 = kBase64EncodeTable.find(str[i + 1]);
      const std::string::size_type s3 = kBase64EncodeTable.find(str[i + 2]);
      const std::string::size_type s4 = kBase64EncodeTable.find(str[i + 3]);

      if (s1 == std::string::npos || s2 == std::string::npos ||
          s3 == std::string::npos || s4 == std::string::npos) {
        ByteData byteData(dst);
        return byteData;
      }

      cdst.push_back(
          static_cast<uint8_t>(((s1 & 0x3F) << 2) | ((s2 & 0x30) >> 4)));
      cdst.push_back(
          static_cast<uint8_t>(((s2 & 0x0F) << 4) | ((s3 & 0x3C) >> 2)));
      cdst.push_back(
          static_cast<uint8_t>(((s3 & 0x03) << 6) | ((s4 & 0x3F) >> 0)));
    }
  }
  dst.swap(cdst);
  ByteData byteData(dst);
  return byteData;
}